

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,double value)

{
  allocator<char> *__s;
  size_t sVar1;
  allocator<char> *paVar2;
  allocator<char> *paVar3;
  char buffer [32];
  allocator<char> local_39 [41];
  
  __s = local_39 + 1;
  sprintf((char *)__s,"%#.16g");
  sVar1 = strlen((char *)__s);
  if (local_39[sVar1] == (allocator<char>)0x30) {
    for (paVar2 = local_39 + sVar1;
        (paVar3 = paVar2, __s < paVar2 && (*paVar2 == (allocator<char>)0x30)); paVar2 = paVar2 + -1)
    {
    }
    for (; __s <= paVar3; paVar3 = paVar3 + -1) {
      if (9 < (byte)*paVar3 - 0x30) {
        if (*paVar3 == (allocator<char>)0x2e) {
          paVar2[2] = (allocator<char>)0x0;
        }
        break;
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)(local_39 + 1),local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string valueToString( double value )
{
   char buffer[32];
#if defined(_MSC_VER) && defined(__STDC_SECURE_LIB__) // Use secure version with visual studio 2005 to avoid warning. 
   sprintf_s(buffer, sizeof(buffer), "%#.16g", value); 
#else	
   sprintf(buffer, "%#.16g", value); 
#endif
   char* ch = buffer + strlen(buffer) - 1;
   if (*ch != '0') return buffer; // nothing to truncate, so save time
   while(ch > buffer && *ch == '0'){
     --ch;
   }
   char* last_nonzero = ch;
   while(ch >= buffer){
     switch(*ch){
     case '0':
     case '1':
     case '2':
     case '3':
     case '4':
     case '5':
     case '6':
     case '7':
     case '8':
     case '9':
       --ch;
       continue;
     case '.':
       // Truncate zeroes to save bytes in output, but keep one.
       *(last_nonzero+2) = '\0';
       return buffer;
     default:
       return buffer;
     }
   }
   return buffer;
}